

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

Instr * __thiscall Inline::InlineSpread(Inline *this,Instr *spreadCall)

{
  Opnd *pOVar1;
  Instr *bailOutTarget;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *pJVar6;
  Instr *pIVar7;
  AddrOpnd *pAVar8;
  SymOpnd *pSVar9;
  StackSym *pSVar10;
  BailOutInstrTemplate<IR::Instr> *this_00;
  RegOpnd *pRVar11;
  
  bVar3 = Lowerer::IsSpreadCall(spreadCall);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x16fe,"(Lowerer::IsSpreadCall(spreadCall))",
                       "Lowerer::IsSpreadCall(spreadCall)");
    if (!bVar3) goto LAB_00500f7c;
    *puVar5 = 0;
  }
  pJVar6 = Func::GetJITFunctionBody(spreadCall->m_func);
  bVar3 = JITTimeFunctionBody::IsInlineSpreadDisabled(pJVar6);
  if (!bVar3) {
    pJVar6 = Func::GetJITFunctionBody(this->topFunc);
    bVar3 = JITTimeFunctionBody::IsInlineSpreadDisabled(pJVar6);
    if (bVar3) {
      return spreadCall;
    }
    pIVar7 = Lowerer::GetLdSpreadIndicesInstr(spreadCall);
    pOVar1 = pIVar7->m_src1;
    pAVar8 = IR::Opnd::AsAddrOpnd(pOVar1);
    if (pAVar8->addrOpndKind != AddrOpndKindDynamicAuxBufferRef) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x1709,
                         "(spreadIndicesOpnd->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindDynamicAuxBufferRef)"
                         ,
                         "spreadIndicesOpnd->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindDynamicAuxBufferRef"
                        );
      if (!bVar3) goto LAB_00500f7c;
      *puVar5 = 0;
    }
    pAVar8 = IR::Opnd::AsAddrOpnd(pOVar1);
    if (*pAVar8->m_metadata == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x170c,"(spreadIndices->count > 0)","spreadIndices->count > 0");
      if (!bVar3) goto LAB_00500f7c;
      *puVar5 = 0;
    }
    pSVar9 = IR::Opnd::AsSymOpnd(pIVar7->m_src2);
    pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
    bailOutTarget = (pSVar10->field_5).m_instrDef;
    AVar4 = StackSym::GetArgSlotNum(pSVar10);
    if (AVar4 < 3) {
      IR::Instr::ReplaceSrc2(spreadCall,&pSVar9->super_Opnd);
      IR::Instr::Remove(pIVar7);
      pOVar1 = bailOutTarget->m_src1;
      bailOutTarget->m_opcode = ArgOut_A_SpreadArg;
      this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                          (BailOnNotSpreadable,BailOutOnInlineFunction,bailOutTarget,
                           bailOutTarget->m_func);
      IR::Instr::SetSrc1(&this_00->super_Instr,pOVar1);
      IR::Instr::InsertBefore(bailOutTarget,&this_00->super_Instr);
      pSVar9 = IR::Opnd::AsSymOpnd(bailOutTarget->m_src2);
      pSVar10 = Sym::AsStackSym(pSVar9->m_sym);
      pIVar7 = (pSVar10->field_5).m_instrDef;
      pIVar7->m_opcode = ArgOut_A_Dynamic;
      pRVar11 = IR::Opnd::AsRegOpnd(pIVar7->m_src2);
      pSVar10 = Sym::AsStackSym(&pRVar11->m_sym->super_Sym);
      if (((pSVar10->field_5).m_instrDef)->m_opcode != StartCall) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x172e,"(argInstr->m_opcode == Js::OpCode::StartCall)",
                           "argInstr->m_opcode == Js::OpCode::StartCall");
        if (!bVar3) {
LAB_00500f7c:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      spreadCall->m_opcode = CallIDynamicSpread;
    }
  }
  return spreadCall;
}

Assistant:

IR::Instr *
Inline::InlineSpread(IR::Instr *spreadCall)
{
    Assert(Lowerer::IsSpreadCall(spreadCall));

    if (spreadCall->m_func->GetJITFunctionBody()->IsInlineSpreadDisabled()
        || this->topFunc->GetJITFunctionBody()->IsInlineSpreadDisabled())
    {
        return spreadCall;
    }

    IR::Instr *spreadIndicesInstr = Lowerer::GetLdSpreadIndicesInstr(spreadCall);

    IR::Opnd *spreadIndicesOpnd = spreadIndicesInstr->GetSrc1();
    Assert(spreadIndicesOpnd->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindDynamicAuxBufferRef);

    Js::AuxArray<uint32>* spreadIndices = static_cast<Js::AuxArray<uint32>*>(spreadIndicesOpnd->AsAddrOpnd()->m_metadata);
    Assert(spreadIndices->count > 0);

    IR::Instr *argInstr = spreadIndicesInstr;

    IR::SymOpnd *argLinkOpnd = argInstr->GetSrc2()->AsSymOpnd();
    StackSym *argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    argInstr = argLinkSym->m_instrDef;

    // We only support one spread argument for inlining.
    if (argLinkSym->GetArgSlotNum() > 2)
    {
        return spreadCall;
    }

    // We are now committed to inlining spread. Remove the LdSpreadIndices instr
    // and convert the spread and 'this' ArgOuts.
    spreadCall->ReplaceSrc2(argLinkOpnd);
    spreadIndicesInstr->Remove();

    // Insert the bailout before the array ArgOut
    IR::Opnd *arrayOpnd = argInstr->GetSrc1();
    argInstr->m_opcode = Js::OpCode::ArgOut_A_SpreadArg;
    IR::Instr *bailoutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotSpreadable, IR::BailOutOnInlineFunction, argInstr, argInstr->m_func);
    bailoutInstr->SetSrc1(arrayOpnd);
    argInstr->InsertBefore(bailoutInstr);

    argLinkOpnd = argInstr->GetSrc2()->AsSymOpnd();
    argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    argInstr = argLinkSym->m_instrDef;
    argInstr->m_opcode = Js::OpCode::ArgOut_A_Dynamic;

    IR::RegOpnd *startCallDstOpnd = argInstr->GetSrc2()->AsRegOpnd();
    argLinkSym = startCallDstOpnd->m_sym->AsStackSym();
    argInstr = argLinkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::StartCall);

    spreadCall->m_opcode = Js::OpCode::CallIDynamicSpread;

    return spreadCall;
}